

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O2

void __thiscall Portal::setup(Portal *this,Spritesheet *spritesheet,int height)

{
  Animation *this_00;
  pointer pSVar1;
  float fVar2;
  
  this_00 = &this->animation;
  pSVar1 = (spritesheet->sprites).
           super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (this->flipVertically == true) {
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&this_00->frames,pSVar1 + 0x29);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&this_00->frames,
               (spritesheet->sprites).
               super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
               super__Vector_impl_data._M_start + 0x2a);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&this_00->frames,
               (spritesheet->sprites).
               super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
               super__Vector_impl_data._M_start + 0x2b);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&this_00->frames,
               (spritesheet->sprites).
               super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
               super__Vector_impl_data._M_start + 0x2c);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&this_00->frames,
               (spritesheet->sprites).
               super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
               super__Vector_impl_data._M_start + 0x2d);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&this_00->frames,
               (spritesheet->sprites).
               super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
               super__Vector_impl_data._M_start + 0x2e);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&this_00->frames,
               (spritesheet->sprites).
               super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
               super__Vector_impl_data._M_start + 0x2f);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&this_00->frames,
               (spritesheet->sprites).
               super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
               super__Vector_impl_data._M_start + 0x30);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&this_00->frames,
               (spritesheet->sprites).
               super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
               super__Vector_impl_data._M_start + 0x31);
    fVar2 = 32.0;
  }
  else {
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&this_00->frames,pSVar1 + 0x32);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&this_00->frames,
               (spritesheet->sprites).
               super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
               super__Vector_impl_data._M_start + 0x33);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&this_00->frames,
               (spritesheet->sprites).
               super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
               super__Vector_impl_data._M_start + 0x34);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&this_00->frames,
               (spritesheet->sprites).
               super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
               super__Vector_impl_data._M_start + 0x35);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&this_00->frames,
               (spritesheet->sprites).
               super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
               super__Vector_impl_data._M_start + 0x36);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&this_00->frames,
               (spritesheet->sprites).
               super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
               super__Vector_impl_data._M_start + 0x37);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&this_00->frames,
               (spritesheet->sprites).
               super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
               super__Vector_impl_data._M_start + 0x38);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&this_00->frames,
               (spritesheet->sprites).
               super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
               super__Vector_impl_data._M_start + 0x39);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&this_00->frames,
               (spritesheet->sprites).
               super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
               super__Vector_impl_data._M_start + 0x3a);
    fVar2 = (float)height + -32.0;
  }
  (this->super_AABB).center.field_0.field_0.y = fVar2;
  (this->animation).millisPerFrame = 0x32;
  return;
}

Assistant:

void Portal::setup(piksel::Spritesheet& spritesheet, int height) {
    if (flipVertically) {
        animation.frames.push_back(spritesheet.sprites[41]);
        animation.frames.push_back(spritesheet.sprites[42]);
        animation.frames.push_back(spritesheet.sprites[43]);
        animation.frames.push_back(spritesheet.sprites[44]);
        animation.frames.push_back(spritesheet.sprites[45]);
        animation.frames.push_back(spritesheet.sprites[46]);
        animation.frames.push_back(spritesheet.sprites[47]);
        animation.frames.push_back(spritesheet.sprites[48]);
        animation.frames.push_back(spritesheet.sprites[49]);

        center.y = 32.0f;
    } else {
        animation.frames.push_back(spritesheet.sprites[50]);
        animation.frames.push_back(spritesheet.sprites[51]);
        animation.frames.push_back(spritesheet.sprites[52]);
        animation.frames.push_back(spritesheet.sprites[53]);
        animation.frames.push_back(spritesheet.sprites[54]);
        animation.frames.push_back(spritesheet.sprites[55]);
        animation.frames.push_back(spritesheet.sprites[56]);
        animation.frames.push_back(spritesheet.sprites[57]);
        animation.frames.push_back(spritesheet.sprites[58]);

        center.y = height - PORTAL_HEIGHT / 2.0f;
    }

    animation.millisPerFrame = 50;
}